

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall Pathie::GlobError::GlobError(GlobError *this,int val)

{
  string local_210 [32];
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [380];
  int local_14;
  GlobError *pGStack_10;
  int val_local;
  GlobError *this_local;
  
  local_14 = val;
  pGStack_10 = this;
  PathieError::PathieError(&this->super_PathieError);
  *(undefined ***)&this->super_PathieError = &PTR__GlobError_0011dc10;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,local_14);
  this->m_val = local_14;
  std::__cxx11::stringstream::str();
  std::operator+((char *)local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Glob error code ");
  std::operator+(local_1d0,(char *)local_1f0);
  std::__cxx11::string::operator=
            ((string *)&(this->super_PathieError).m_pathie_errmsg,(string *)local_1d0);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_210);
  if (local_14 == 1) {
    std::__cxx11::string::operator+=
              ((string *)&(this->super_PathieError).m_pathie_errmsg,"GLOB_NOSPACE");
  }
  else if (local_14 == 2) {
    std::__cxx11::string::operator+=
              ((string *)&(this->super_PathieError).m_pathie_errmsg,"GLOB_ABORTED");
  }
  else if (local_14 == 3) {
    std::__cxx11::string::operator+=
              ((string *)&(this->super_PathieError).m_pathie_errmsg,"GLOB_NOMATCH");
  }
  else {
    std::__cxx11::string::operator+=
              ((string *)&(this->super_PathieError).m_pathie_errmsg,"Unknown glob error");
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

GlobError::GlobError(int val)
{
  std::stringstream ss;
  ss << val;

  m_val = val;

  m_pathie_errmsg = "Glob error code " + ss.str() + ": ";

  switch(val) {
  case GLOB_NOSPACE:
    m_pathie_errmsg += "GLOB_NOSPACE";
    break;
  case GLOB_ABORTED:
    m_pathie_errmsg += "GLOB_ABORTED";
    break;
  case GLOB_NOMATCH:
    m_pathie_errmsg += "GLOB_NOMATCH";
    break;
  default:
    m_pathie_errmsg += "Unknown glob error";
    break;
  }
}